

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void parse_cache(vw *all,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *cache_files,bool kill_cache,bool quiet)

{
  vw_ostream *pvVar1;
  pointer pbVar2;
  io_buf *piVar3;
  int filepointer;
  uint32_t uVar4;
  ostream *poVar5;
  pointer newname;
  
  all->p->write_cache = false;
  newname = (cache_files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (cache_files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = &all->trace_message;
  do {
    if (newname == pbVar2) {
      all->parse_mask = ~(-1L << ((byte)all->num_bits & 0x3f));
      if ((cache_files->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (cache_files->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      if (!quiet) {
        poVar5 = std::operator<<(&pvVar1->super_ostream,"using no cache");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      v_array<char>::delete_v(&all->p->output->space);
      return;
    }
    if (kill_cache) {
LAB_0019536a:
      make_write_cache(all,newname,quiet);
    }
    else {
      piVar3 = all->p->input;
      filepointer = (**piVar3->_vptr_io_buf)
                              (piVar3,(newname->_M_dataplus)._M_p,(ulong)all->stdin_off,1);
      if (filepointer == -1) goto LAB_0019536a;
      uVar4 = cache_numbits(all->p->input,filepointer);
      if (uVar4 < all->num_bits) {
        if (!quiet) {
          poVar5 = std::operator<<(&pvVar1->super_ostream,
                                   "WARNING: cache file is ignored as it\'s made with less bit precision than required!"
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        (*all->p->input->_vptr_io_buf[8])();
        goto LAB_0019536a;
      }
      if (!quiet) {
        poVar5 = std::operator<<(&pvVar1->super_ostream,"using cache_file = ");
        poVar5 = std::operator<<(poVar5,(newname->_M_dataplus)._M_p);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      all->p->reader = read_cached_features;
      all->p->sorted_cache = uVar4 == all->num_bits;
      all->p->resettable = true;
    }
    newname = newname + 1;
  } while( true );
}

Assistant:

void parse_cache(vw& all, std::vector<std::string> cache_files, bool kill_cache, bool quiet)
{
  all.p->write_cache = false;

  for (auto& file : cache_files)
  {
    int f = -1;
    if (!kill_cache)
      try
      {
        f = all.p->input->open_file(file.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (const exception&)
      {
        f = -1;
      }
    if (f == -1)
      make_write_cache(all, file, quiet);
    else
    {
      uint64_t c = cache_numbits(all.p->input, f);
      if (c < all.num_bits)
      {
        if (!quiet)
          all.trace_message << "WARNING: cache file is ignored as it's made with less bit precision than required!"
                            << endl;
        all.p->input->close_file();
        make_write_cache(all, file, quiet);
      }
      else
      {
        if (!quiet)
          all.trace_message << "using cache_file = " << file.c_str() << endl;
        all.p->reader = read_cached_features;
        if (c == all.num_bits)
          all.p->sorted_cache = true;
        else
          all.p->sorted_cache = false;
        all.p->resettable = true;
      }
    }
  }

  all.parse_mask = ((uint64_t)1 << all.num_bits) - 1;
  if (cache_files.size() == 0)
  {
    if (!quiet)
      all.trace_message << "using no cache" << endl;
    all.p->output->space.delete_v();
  }
}